

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

Vec_Int_t * Ga2_ManRefine(Ga2_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Ga2_Man_t *pGVar3;
  Abc_Cex_t *pAVar4;
  bool bVar5;
  int local_40;
  int local_3c;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVec;
  Vec_Int_t *vMap;
  Abc_Cex_t *pCex;
  Ga2_Man_t *p_local;
  
  pCex = (Abc_Cex_t *)p;
  if (p->pPars->fAddLayer == 0) {
    Ga2_GlaPrepareCexAndMap(p,(Abc_Cex_t **)&vMap,&vVec);
    pGVar3 = (Ga2_Man_t *)
             Rnm_ManRefine(*(Rnm_Man_t **)(pCex + 4),(Abc_Cex_t *)vMap,vVec,
                           *(int *)(*(long *)&pCex->nRegs + 0x38),
                           *(int *)(*(long *)&pCex->nRegs + 0x40),1);
    Abc_CexFree((Abc_Cex_t *)vMap);
    iVar2 = Vec_IntSize((Vec_Int_t *)pGVar3);
    if (iVar2 == 0) {
      Vec_IntFree((Vec_Int_t *)pGVar3);
      Abc_CexFreeP((Abc_Cex_t **)(*(long *)pCex + 0x150));
      pAVar4 = Ga2_ManDeriveCex((Ga2_Man_t *)pCex,vVec);
      *(Abc_Cex_t **)(*(long *)pCex + 0x150) = pAVar4;
      Vec_IntFree(vVec);
      p_local = (Ga2_Man_t *)0x0;
    }
    else {
      Vec_IntFree(vVec);
      local_40 = 0;
      local_3c = 0;
      while( true ) {
        iVar2 = Vec_IntSize((Vec_Int_t *)pGVar3);
        bVar5 = false;
        if (local_3c < iVar2) {
          pGVar1 = *(Gia_Man_t **)pCex;
          iVar2 = Vec_IntEntry((Vec_Int_t *)pGVar3,local_3c);
          _k = Gia_ManObj(pGVar1,iVar2);
          bVar5 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar2 = Ga2_ObjIsAbs((Ga2_Man_t *)pCex,_k);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjId(*(Gia_Man_t **)pCex,_k);
          Vec_IntWriteEntry((Vec_Int_t *)pGVar3,local_40,iVar2);
          local_40 = local_40 + 1;
        }
        local_3c = local_3c + 1;
      }
      Vec_IntShrink((Vec_Int_t *)pGVar3,local_40);
      local_3c = 0;
      while( true ) {
        iVar2 = Vec_IntSize((Vec_Int_t *)pGVar3);
        bVar5 = false;
        if (local_3c < iVar2) {
          pGVar1 = *(Gia_Man_t **)pCex;
          iVar2 = Vec_IntEntry((Vec_Int_t *)pGVar3,local_3c);
          _k = Gia_ManObj(pGVar1,iVar2);
          bVar5 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        if (-1 < *(long *)_k) {
          __assert_fail("pObj->fPhase",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0x530,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
        }
        local_3c = local_3c + 1;
      }
      iVar2 = Vec_IntSize((Vec_Int_t *)pGVar3);
      pCex[5].nPis = iVar2 + pCex[5].nPis;
      p_local = pGVar3;
    }
  }
  else {
    pGVar3 = (Ga2_Man_t *)Vec_IntAlloc(100);
    local_3c = 0;
    while( true ) {
      iVar2 = Vec_IntSize(*(Vec_Int_t **)&pCex[2].nRegs);
      bVar5 = false;
      if (local_3c < iVar2) {
        pGVar1 = *(Gia_Man_t **)pCex;
        iVar2 = Vec_IntEntry(*(Vec_Int_t **)&pCex[2].nRegs,local_3c);
        _k = Gia_ManObj(pGVar1,iVar2);
        bVar5 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      if ((local_3c != 0) && (iVar2 = Ga2_ObjIsAbs((Ga2_Man_t *)pCex,_k), iVar2 == 0)) {
        if (-1 < *(long *)_k) {
          __assert_fail("pObj->fPhase",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0x50f,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
        }
        iVar2 = Ga2_ObjIsLeaf((Ga2_Man_t *)pCex,_k);
        if (iVar2 == 0) {
          __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0x510,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
        }
        iVar2 = Gia_ObjIsAnd(_k);
        if ((iVar2 == 0) && (iVar2 = Gia_ObjIsCi(_k), iVar2 == 0)) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0x511,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
        }
        iVar2 = Gia_ObjIsPi(*(Gia_Man_t **)pCex,_k);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjId(*(Gia_Man_t **)pCex,_k);
          Vec_IntPush((Vec_Int_t *)pGVar3,iVar2);
        }
      }
      local_3c = local_3c + 1;
    }
    iVar2 = Vec_IntSize((Vec_Int_t *)pGVar3);
    pCex[5].nPis = iVar2 + pCex[5].nPis;
    p_local = pGVar3;
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Ga2_ManRefine( Ga2_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap, * vVec;
    Gia_Obj_t * pObj;
    int i, k;
    if ( p->pPars->fAddLayer )
    {
        // use simplified refinement strategy, which adds logic near at PPI without finding important ones
        vVec = Vec_IntAlloc( 100 );
        Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
        {
            if ( !i ) continue;
            if ( Ga2_ObjIsAbs(p, pObj) )
                continue;
            assert( pObj->fPhase );
            assert( Ga2_ObjIsLeaf(p, pObj) );
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
            if ( Gia_ObjIsPi(p->pGia, pObj) )
                continue;
            Vec_IntPush( vVec, Gia_ObjId(p->pGia, pObj) );
        }
        p->nObjAdded += Vec_IntSize(vVec);
        return vVec;
    }
    Ga2_GlaPrepareCexAndMap( p, &pCex, &vMap );
 //    Rf2_ManRefine( p->pRf2, pCex, vMap, p->pPars->fPropFanout, 1 );
    vVec = Rnm_ManRefine( p->pRnm, pCex, vMap, p->pPars->fPropFanout, p->pPars->fNewRefine, 1 );
//    printf( "Refinement %d\n", Vec_IntSize(vVec) );
    Abc_CexFree( pCex );
    if ( Vec_IntSize(vVec) == 0 )
    {
        Vec_IntFree( vVec );
        Abc_CexFreeP( &p->pGia->pCexSeq );
        p->pGia->pCexSeq = Ga2_ManDeriveCex( p, vMap );
        Vec_IntFree( vMap );
        return NULL;
    }
    Vec_IntFree( vMap );
    // remove those already added
    k = 0;
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        if ( !Ga2_ObjIsAbs(p, pObj) )
            Vec_IntWriteEntry( vVec, k++, Gia_ObjId(p->pGia, pObj) );
    Vec_IntShrink( vVec, k );

    // these objects should be PPIs that are not abstracted yet
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        assert( pObj->fPhase );//&& Ga2_ObjIsLeaf(p, pObj) );
    p->nObjAdded += Vec_IntSize(vVec);
    return vVec;
}